

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_MSR_reg(DisasContext_conflict1 *s,arg_MSR_reg *a)

{
  uint32_t mask_00;
  int iVar1;
  TCGv_i32 t0;
  uint32_t mask;
  TCGv_i32 tmp;
  arg_MSR_reg *a_local;
  DisasContext_conflict1 *s_local;
  
  mask_00 = msr_mask(s,a->mask,a->r);
  iVar1 = arm_dc_feature(s,9);
  if (iVar1 == 0) {
    t0 = load_reg(s,a->rn);
    iVar1 = gen_set_psr(s,mask_00,a->r,t0);
    if (iVar1 != 0) {
      unallocated_encoding_aarch64(s);
    }
    s_local._7_1_ = true;
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_MSR_reg(DisasContext *s, arg_MSR_reg *a)
{
    TCGv_i32 tmp;
    uint32_t mask = msr_mask(s, a->mask, a->r);

    if (arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    tmp = load_reg(s, a->rn);
    if (gen_set_psr(s, mask, a->r, tmp)) {
        unallocated_encoding(s);
    }
    return true;
}